

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O3

void __thiscall
cmInstallCommandArguments::cmInstallCommandArguments
          (cmInstallCommandArguments *this,string *defaultComponent)

{
  cmCommandArgumentGroup *group;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  group = &this->ArgumentGroup;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmCAString::cmCAString(&this->Destination,&this->Parser,"DESTINATION",group);
  cmCAString::cmCAString(&this->Component,&this->Parser,"COMPONENT",group);
  cmCAString::cmCAString(&this->NamelinkComponent,&this->Parser,"NAMELINK_COMPONENT",group);
  cmCAEnabler::cmCAEnabler(&this->ExcludeFromAll,&this->Parser,"EXCLUDE_FROM_ALL",group);
  cmCAString::cmCAString(&this->Rename,&this->Parser,"RENAME",group);
  cmCAStringVector::cmCAStringVector(&this->Permissions,&this->Parser,"PERMISSIONS",group);
  cmCAStringVector::cmCAStringVector(&this->Configurations,&this->Parser,"CONFIGURATIONS",group);
  cmCAEnabler::cmCAEnabler(&this->Optional,&this->Parser,"OPTIONAL",group);
  cmCAEnabler::cmCAEnabler(&this->NamelinkOnly,&this->Parser,"NAMELINK_ONLY",group);
  cmCAEnabler::cmCAEnabler(&this->NamelinkSkip,&this->Parser,"NAMELINK_SKIP",group);
  cmCAString::cmCAString(&this->Type,&this->Parser,"TYPE",group);
  (this->DestinationString)._M_dataplus._M_p = (pointer)&(this->DestinationString).field_2;
  (this->DestinationString)._M_string_length = 0;
  (this->DestinationString).field_2._M_local_buf[0] = '\0';
  (this->PermissionsString)._M_dataplus._M_p = (pointer)&(this->PermissionsString).field_2;
  (this->PermissionsString)._M_string_length = 0;
  (this->PermissionsString).field_2._M_local_buf[0] = '\0';
  this->GenericArguments = (cmInstallCommandArguments *)0x0;
  paVar2 = &(this->DefaultComponentName).field_2;
  (this->DefaultComponentName)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (defaultComponent->_M_dataplus)._M_p;
  paVar1 = &defaultComponent->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&defaultComponent->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->DefaultComponentName).field_2 + 8) = uVar4;
  }
  else {
    (this->DefaultComponentName)._M_dataplus._M_p = pcVar3;
    (this->DefaultComponentName).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->DefaultComponentName)._M_string_length = defaultComponent->_M_string_length;
  (defaultComponent->_M_dataplus)._M_p = (pointer)paVar1;
  defaultComponent->_M_string_length = 0;
  (defaultComponent->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmInstallCommandArguments::cmInstallCommandArguments(
  std::string defaultComponent)
  : Destination(&Parser, "DESTINATION", &ArgumentGroup)
  , Component(&Parser, "COMPONENT", &ArgumentGroup)
  , NamelinkComponent(&Parser, "NAMELINK_COMPONENT", &ArgumentGroup)
  , ExcludeFromAll(&Parser, "EXCLUDE_FROM_ALL", &ArgumentGroup)
  , Rename(&Parser, "RENAME", &ArgumentGroup)
  , Permissions(&Parser, "PERMISSIONS", &ArgumentGroup)
  , Configurations(&Parser, "CONFIGURATIONS", &ArgumentGroup)
  , Optional(&Parser, "OPTIONAL", &ArgumentGroup)
  , NamelinkOnly(&Parser, "NAMELINK_ONLY", &ArgumentGroup)
  , NamelinkSkip(&Parser, "NAMELINK_SKIP", &ArgumentGroup)
  , Type(&Parser, "TYPE", &ArgumentGroup)
  , GenericArguments(nullptr)
  , DefaultComponentName(std::move(defaultComponent))
{
}